

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderDesc.cpp
# Opt level: O2

Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
renderdesc::Pipeline::load_abi_cxx11_
          (Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Pipeline *this,string_view s)

{
  Value *this_00;
  reference_wrapper<const_yaml::Mapping> *prVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  Pipeline pipeline;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  result;
  ExpectedRef<const_Mapping,_std::string> root_mapping_result;
  Loader loader;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  root;
  undefined1 local_238 [16];
  Texture local_228;
  pointer local_1f8;
  pointer pPStack_1f0;
  pointer local_1e8;
  pointer pPStack_1e0;
  pointer local_1d8;
  pointer pCStack_1d0;
  pointer local_1c8;
  Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  size_type local_170;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_168;
  ExpectedRef<const_Mapping,_std::string> local_158;
  undefined1 local_130 [24];
  pointer pbStack_118;
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_90;
  
  yaml::parse_abi_cxx11_(&local_90,(yaml *)this,s);
  if (local_90.has_value_ == false) {
    pbVar2 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::error(&local_90);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_238,
                   "Cannot load pipeline: ",pbVar2);
    local_130._0_8_ = local_130 + 0x10;
    if ((Texture *)local_238._0_8_ == &local_228) {
      pbStack_118 = (pointer)local_228._8_8_;
    }
    else {
      local_130._0_8_ = local_238._0_8_;
    }
    local_130._8_8_ = local_238._8_8_;
    local_238._8_8_ = (pointer)0x0;
    local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
    local_238._0_8_ = &local_228;
    Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::Expected(__return_storage_ptr__,(UnexpectedType *)local_130);
    std::__cxx11::string::~string((string *)local_130);
    std::__cxx11::string::~string((string *)local_238);
  }
  else {
    this_00 = Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::value(&local_90);
    yaml::Value::getMapping_abi_cxx11_(&local_158,this_00);
    if (local_158.has_value_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_238,"Root pipeline desc object is not a mapping",
                 (allocator<char> *)&local_1c0);
      local_130._0_8_ = local_130 + 0x10;
      if ((Texture *)local_238._0_8_ == &local_228) {
        pbStack_118 = (pointer)local_228._8_8_;
      }
      else {
        local_130._0_8_ = local_238._0_8_;
      }
      local_130._8_8_ = local_238._8_8_;
      local_238._8_8_ = (pointer)0x0;
      local_228._0_8_ = local_228._0_8_ & 0xffffffffffffff00;
      local_238._0_8_ = &local_228;
      Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::Expected(__return_storage_ptr__,(UnexpectedType *)local_130);
      std::__cxx11::string::~string((string *)local_130);
      std::__cxx11::string::~string((string *)local_238);
    }
    else {
      local_1d8 = (pointer)0x0;
      pCStack_1d0 = (pointer)0x0;
      local_1e8 = (pointer)0x0;
      pPStack_1e0 = (pointer)0x0;
      local_1f8 = (pointer)0x0;
      pPStack_1f0 = (pointer)0x0;
      local_228.file.field_2._M_allocated_capacity = 0;
      local_228.file.field_2._8_8_ = (pointer)0x0;
      local_228.file._M_dataplus._M_p = (pointer)0x0;
      local_228.file._M_string_length = 0;
      local_228._0_8_ = (pointer)0x0;
      local_228._8_8_ = (pointer)0x0;
      local_238._0_8_ = (Texture *)0x0;
      local_238._8_8_ = (pointer)0x0;
      local_1c8 = (pointer)0x0;
      prVar1 = Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::value(&local_158);
      local_130._8_8_ = prVar1->_M_data;
      local_130._0_8_ = (Pipeline *)local_238;
      memset(local_130 + 0x10,0,0x90);
      Loader::load_abi_cxx11_(&local_1c0,(Loader *)local_130);
      if (local_1c0.has_value_ == false) {
        pbVar2 = Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 ::error(&local_1c0);
        std::operator+(&local_198,"Cannot load pipeline: ",pbVar2);
        local_178 = &local_168;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_198._M_dataplus._M_p == &local_198.field_2) {
          local_168._8_8_ = local_198.field_2._8_8_;
        }
        else {
          local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_198._M_dataplus._M_p;
        }
        local_170 = local_198._M_string_length;
        local_198._M_string_length = 0;
        local_198.field_2._M_local_buf[0] = '\0';
        local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
        Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(UnexpectedType *)&local_178);
        std::__cxx11::string::~string((string *)&local_178);
        std::__cxx11::string::~string((string *)&local_198);
      }
      else {
        Expected<renderdesc::Pipeline,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::Expected(__return_storage_ptr__,(Pipeline *)local_238);
      }
      Expected<void,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::~Expected(&local_1c0);
      Loader::~Loader((Loader *)local_130);
      ~Pipeline((Pipeline *)local_238);
    }
    Expected<std::reference_wrapper<const_yaml::Mapping>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~Expected(&local_158);
  }
  Expected<yaml::Value,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Expected(&local_90);
  return __return_storage_ptr__;
}

Assistant:

Expected<Pipeline, std::string> Pipeline::load(std::string_view s) {
	const auto root = yaml::parse(s);
	if (!root)
		return Unexpected("Cannot load pipeline: " + root.error());

	auto root_mapping_result = root.value().getMapping();
	if (!root_mapping_result)
		return Unexpected<std::string>("Root pipeline desc object is not a mapping");

	Pipeline pipeline;
	Loader loader(pipeline, root_mapping_result.value());
	const auto result = loader.load();
	if (!result)
		return Unexpected("Cannot load pipeline: " + result.error());

	return pipeline;
}